

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_rand.c
# Opt level: O0

void evutil_free_secure_rng_globals_locks(void)

{
  void *lock_tmp_;
  
  if (arc4rand_lock != (void *)0x0) {
    if ((arc4rand_lock != (void *)0x0) &&
       (evthread_lock_fns_.free != (_func_void_void_ptr_uint *)0x0)) {
      (*evthread_lock_fns_.free)(arc4rand_lock,0);
    }
    arc4rand_lock = (void *)0x0;
  }
  return;
}

Assistant:

static void
evutil_free_secure_rng_globals_locks(void)
{
#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (arc4rand_lock != NULL) {
		EVTHREAD_FREE_LOCK(arc4rand_lock, 0);
		arc4rand_lock = NULL;
	}
#endif
	return;
}